

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

void __thiscall
icu_63::UnicodeSet::UnicodeSet
          (UnicodeSet *this,uint16_t *data,int32_t dataLen,ESerialization serialization,
          UErrorCode *ec)

{
  ushort uVar1;
  int iVar2;
  UChar32 *pUVar3;
  ushort uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint16_t *puVar8;
  uint uVar9;
  
  (this->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeSet_003e4a38;
  (this->super_UnicodeFilter).super_UnicodeMatcher._vptr_UnicodeMatcher =
       (_func_int **)&PTR__UnicodeSet_003e4b50;
  this->len = 1;
  this->capacity = 0x11;
  this->list = (UChar32 *)0x0;
  this->bmpSet = (BMPSet *)0x0;
  this->buffer = (UChar32 *)0x0;
  this->bufferCapacity = 0;
  this->patLen = 0;
  this->pat = (char16_t *)0x0;
  this->strings = (UVector *)0x0;
  *(undefined8 *)((long)&this->strings + 1) = 0;
  *(undefined8 *)((long)&this->stringSpan + 1) = 0;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    if (((dataLen < 1) || (data == (uint16_t *)0x0)) || (serialization != kSerialized)) {
      *ec = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      allocateStrings(this,ec);
      if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
        uVar1 = *data;
        uVar4 = uVar1;
        if ((short)uVar1 < 0) {
          uVar4 = data[1];
        }
        uVar6 = (ulong)uVar4;
        iVar2 = (int)((uVar1 & 0x7fff) - (uint)uVar4) / 2;
        iVar5 = iVar2 + (uint)uVar4;
        this->len = iVar5;
        this->capacity = iVar2 + (uint)uVar4 + 1;
        pUVar3 = (UChar32 *)uprv_malloc_63((long)iVar5 * 4 + 4);
        this->list = pUVar3;
        if ((pUVar3 != (UChar32 *)0x0) && (*ec < U_ILLEGAL_ARGUMENT_ERROR)) {
          uVar9 = ((short)uVar1 < 0) + 1;
          for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
            pUVar3[uVar7] = (uint)data[uVar9 + uVar7];
          }
          iVar2 = this->len;
          puVar8 = data + (ulong)(uVar9 + uVar4) + 1;
          for (; (long)uVar6 < (long)iVar2; uVar6 = uVar6 + 1) {
            pUVar3[uVar6] = CONCAT22(puVar8[-1],*puVar8);
            puVar8 = puVar8 + 2;
          }
          this->len = iVar2 + 1;
          pUVar3[iVar2] = 0x110000;
          return;
        }
        setToBogus(this);
        return;
      }
    }
  }
  setToBogus(this);
  return;
}

Assistant:

UnicodeSet::UnicodeSet(const uint16_t data[], int32_t dataLen, ESerialization serialization, UErrorCode &ec)
  : len(1), capacity(1+START_EXTRA), list(0), bmpSet(0), buffer(0),
    bufferCapacity(0), patLen(0), pat(NULL), strings(NULL), stringSpan(NULL),
    fFlags(0) {

  if(U_FAILURE(ec)) {
    setToBogus();
    return;
  }

  if( (serialization != kSerialized)
      || (data==NULL)
      || (dataLen < 1)) {
    ec = U_ILLEGAL_ARGUMENT_ERROR;
    setToBogus();
    return;
  }

  allocateStrings(ec);
  if (U_FAILURE(ec)) {
    setToBogus();
    return;
  }

  // bmp?
  int32_t headerSize = ((data[0]&0x8000)) ?2:1;
  int32_t bmpLength = (headerSize==1)?data[0]:data[1];

  len = (((data[0]&0x7FFF)-bmpLength)/2)+bmpLength;
#ifdef DEBUG_SERIALIZE
  printf("dataLen %d headerSize %d bmpLen %d len %d. data[0]=%X/%X/%X/%X\n", dataLen,headerSize,bmpLength,len, data[0],data[1],data[2],data[3]);
#endif
  capacity = len+1;
  list = (UChar32*) uprv_malloc(sizeof(UChar32) * capacity);
  if(!list || U_FAILURE(ec)) {
    setToBogus();
    return;
  }
  // copy bmp
  int32_t i;
  for(i = 0; i< bmpLength;i++) {
    list[i] = data[i+headerSize];
#ifdef DEBUG_SERIALIZE
    printf("<<16@%d[%d] %X\n", i+headerSize, i, list[i]);
#endif
  }
  // copy smp
  for(i=bmpLength;i<len;i++) {
    list[i] = ((UChar32)data[headerSize+bmpLength+(i-bmpLength)*2+0] << 16) +
              ((UChar32)data[headerSize+bmpLength+(i-bmpLength)*2+1]);
#ifdef DEBUG_SERIALIZE
    printf("<<32@%d+[%d] %lX\n", headerSize+bmpLength+i, i, list[i]);
#endif
  }
  // terminator
  list[len++]=UNICODESET_HIGH;
}